

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

int Saig_ManExtendOneEval(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  uint uVar1;
  uint uVar2;
  uint Value;
  
  uVar1 = Saig_ManSimInfoGet(vSimInfo,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),
                             iFrame);
  Value = (uint)(uVar1 != 2) * 2 + 1;
  if (uVar1 == 1) {
    Value = 2;
  }
  if (((ulong)pObj->pFanin0 & 1) == 0) {
    Value = uVar1;
  }
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar1 & 7) != 3) {
    if ((uVar1 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                    ,0x9a,"int Saig_ManExtendOneEval(Vec_Ptr_t *, Aig_Obj_t *, int)");
    }
    uVar2 = Saig_ManSimInfoGet(vSimInfo,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
                               iFrame);
    uVar1 = (uint)(uVar2 != 2) * 2 + 1;
    if (uVar2 == 1) {
      uVar1 = 2;
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      uVar1 = uVar2;
    }
    uVar2 = (uVar1 == 2 && Value == 2) ^ 3;
    if (uVar1 == 1) {
      uVar2 = 1;
    }
    if (Value != 1) {
      Value = uVar2;
    }
  }
  Saig_ManSimInfoSet(vSimInfo,pObj,iFrame,Value);
  return Value;
}

Assistant:

int Saig_ManExtendOneEval( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfoNot( Value1 );
    Value = Saig_ManSimInfoAnd( Value0, Value1 );
    Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    return Value;
}